

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

xmlChar * xmlSchemaStrip(xmlChar *value)

{
  byte *cur;
  xmlChar *pxVar1;
  long lVar2;
  xmlChar *start;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  if (value != (xmlChar *)0x0) {
    lVar2 = 0;
    for (cur = value; uVar3 = (ulong)*cur, pbVar5 = cur, uVar3 < 0x21; cur = cur + 1) {
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        pbVar4 = cur;
        if (uVar3 == 0) goto LAB_001d3ae4;
        break;
      }
      lVar2 = lVar2 + 1;
    }
    do {
      pbVar4 = pbVar5 + 1;
      pbVar6 = pbVar5 + 1;
      pbVar5 = pbVar4;
    } while (*pbVar6 != 0);
LAB_001d3ae4:
    pbVar5 = pbVar4 + -1;
    pbVar6 = pbVar4;
    if (cur < pbVar5) {
      pbVar6 = cur + 1;
      do {
        if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) {
          pbVar6 = pbVar5 + 1;
          break;
        }
        pbVar5 = pbVar5 + -1;
      } while (cur < pbVar5);
    }
    if (pbVar4 != pbVar6 || lVar2 != 0) {
      pxVar1 = xmlStrndup(cur,((int)pbVar6 - (int)value) - (int)lVar2);
      return pxVar1;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlSchemaStrip(const xmlChar *value) {
    const xmlChar *start = value, *end, *f;

    if (value == NULL) return(NULL);
    while ((*start != 0) && (IS_BLANK_CH(*start))) start++;
    end = start;
    while (*end != 0) end++;
    f = end;
    end--;
    while ((end > start) && (IS_BLANK_CH(*end))) end--;
    end++;
    if ((start == value) && (f == end)) return(NULL);
    return(xmlStrndup(start, end - start));
}